

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separator.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
flow_cutter::ComputeSeparator::operator()
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ComputeSeparator *this,
          ArrayIDIDFunc *tail,ArrayIDIDFunc *head,int max_separator_size)

{
  int node_count;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_00000084;
  ArrayIDIDFunc *tail_00;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  vector<int,_std::allocator<int>_> *separator;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> pairs;
  RangeIDIDMultiFunc out_arc;
  ArrayIDIDFunc back_arc;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  expanded_graph;
  Separator local_1b8;
  ArrayIDIDFunc *local_190;
  int local_184;
  double local_180;
  _Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
  local_178;
  double local_158;
  double local_150;
  undefined1 local_148 [16];
  _Vector_base<int,_std::allocator<int>_> local_138;
  _Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
  local_120;
  undefined1 local_108 [76];
  pointer piStack_bc;
  pointer local_b4;
  ArrayIDIDFunc local_a8;
  _Vector_base<int,_std::allocator<int>_> local_90;
  Capacity local_78;
  ArrayIDIDFunc *local_70;
  Capacity local_68;
  ArrayIDIDFunc *local_60;
  Capacity local_58;
  ArrayIDIDFunc *local_50;
  Capacity local_48;
  Capacity local_40;
  ArrayIDIDFunc *local_38;
  
  node_count = tail->image_count_;
  iVar6 = max_separator_size;
  invert_sorted_id_id_func<ArrayIDIDFunc>((ArrayIDIDFunc *)local_148);
  compute_back_arc_permutation<ArrayIDIDFunc,ArrayIDIDFunc>(&local_a8,tail,head);
  local_78.original_arc_count = (tail->super_ArrayIDFunc<int>).preimage_count_;
  local_78.original_node_count = tail->image_count_;
  local_108._0_8_ = &local_78;
  uVar1._0_4_ = (this->config).cutter_count;
  uVar1._4_4_ = (this->config).random_seed;
  local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)&(this->config).avoid_augmenting_path;
  local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = (int)(this->config).min_small_side_size;
  local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = (this->config).skip_non_maximum_sides;
  local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)&(this->config).separator_selection;
  local_190 = tail;
  local_70 = tail;
  local_68 = local_78;
  local_60 = head;
  local_58 = local_78;
  local_50 = &local_a8;
  local_48 = local_78;
  local_40 = local_78;
  local_38 = (ArrayIDIDFunc *)local_148;
  ArrayIDFunc<int>::ArrayIDFunc((ArrayIDFunc<int> *)(local_108 + 8),tail->image_count_ * 2);
  local_108._24_8_ = (pointer)0x0;
  local_108._32_8_ = (pointer)0x0;
  local_108._40_8_ = (pointer)0x0;
  local_108._68_8_ =
       local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  piStack_bc = local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b4 = local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_178._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (this->config).cutter_count;
  local_108._56_8_ = uVar1;
  local_108._64_4_ = max_separator_size;
  if (iVar5 < 1) {
    local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)compute_distant_node_pair<ArrayIDIDFunc,ArrayIDIDFunc>(local_190,head);
    std::vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>::
    _M_assign_aux<flow_cutter::SourceTargetPair_const*>
              ((vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>
                *)&local_178,&local_1b8);
  }
  else {
    select_random_source_target_pairs
              ((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                *)&local_1b8,node_count,iVar5,(this->config).random_seed);
    std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
    _M_move_assign((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                    *)&local_178,&local_1b8);
    std::_Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
    ::~_Vector_base((_Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                     *)&local_1b8);
  }
  std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::vector
            ((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              *)&local_120,
             (vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              *)&local_178);
  flow_cutter::expanded_graph::expand_source_target_pair_list
            ((vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
              *)&local_120);
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  ::init((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
          *)local_108,(EVP_PKEY_CTX *)&local_1b8);
  std::_Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
  ~_Vector_base((_Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                 *)&local_1b8);
  std::_Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
  ~_Vector_base(&local_120);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158 = 1.0 / (double)node_count;
  local_180 = 1.79769313486232e+308;
  tail_00 = local_190;
  local_184 = max_separator_size;
  do {
    pvVar4 = MultiCutter::get_current_cut((MultiCutter *)(local_108 + 0x18));
    iVar5 = (int)((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    if (max_separator_size < iVar5) break;
    if (node_count - iVar5 < local_108._48_4_ * 4) {
      local_150 = (double)(int)local_108._48_4_;
      if ((double)iVar5 / local_150 < local_180) {
        flow_cutter::expanded_graph::
        extract_original_separator<ArrayIDIDFunc,ArrayIDIDFunc,flow_cutter::SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>>
                  (&local_1b8,(expanded_graph *)tail_00,head,(ArrayIDIDFunc *)local_108,
                   (SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                    *)CONCAT44(in_register_00000084,iVar6));
        local_138._M_impl.super__Vector_impl_data._M_start =
             local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_138._M_impl.super__Vector_impl_data._M_finish =
             local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_138._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1b8.sep.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        remove_nodes_from_separator_as_long_as_result_is_balanced<ArrayIDIDFunc,ArrayIDIDFunc>
                  ((vector<int,_std::allocator<int>_> *)&local_90,tail_00,head,
                   (vector<int,_std::allocator<int>_> *)&local_138);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(__return_storage_ptr__,&local_90);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_138);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_1b8);
        auVar2._8_8_ = in_XMM2_Qb;
        auVar2._0_8_ = in_XMM2_Qa;
        auVar2 = vcvtusi2sd_avx512f(auVar2,(long)(__return_storage_ptr__->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(__return_storage_ptr__->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_start >> 2);
        local_180 = auVar2._0_8_ / local_150;
        tail_00 = local_190;
        max_separator_size = local_184;
      }
      if (local_180 <= (double)(iVar5 + 1) * local_158) break;
    }
    bVar3 = SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
            ::advance((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                       *)local_108);
  } while (bVar3);
  std::_Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
  ~_Vector_base(&local_178);
  SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
  ::~SimpleCutter((SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
                   *)local_108);
  ArrayIDFunc<int>::~ArrayIDFunc(&local_a8.super_ArrayIDFunc<int>);
  ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> operator()(const Tail& tail, const Head& head, int max_separator_size) const
    {

        const int node_count = tail.image_count();
        const int arc_count = tail.preimage_count();
        (void)arc_count;

        auto out_arc = invert_sorted_id_id_func(tail);
        auto back_arc = compute_back_arc_permutation(tail, head);

        auto expanded_graph = expanded_graph::make_graph(
            make_const_ref_id_id_func(tail), make_const_ref_id_id_func(head),
            make_const_ref_id_id_func(back_arc), make_const_ref_id_func(out_arc));

        Config my_config = config;
        my_config.max_cut_size = max_separator_size;

        auto cutter = make_simple_cutter(expanded_graph, my_config);
        std::vector<SourceTargetPair> pairs;
        if (config.cutter_count > 0)
            pairs = select_random_source_target_pairs(node_count, config.cutter_count, config.random_seed);
        else
            pairs = { compute_distant_node_pair(tail, head) };

        cutter.init(expanded_graph::expand_source_target_pair_list(pairs),
            config.random_seed);

        int balance_num, balance_div;
        switch (((unsigned)config.random_seed * (unsigned)node_count) % 3) {
        case 0:
            balance_num = 1;
            balance_div = 3;
        case 1:
            balance_num = 2;
            balance_div = 5;
        case 2:
            balance_num = 1;
            balance_div = 4;
        }

        double best_score = std::numeric_limits<double>::max();
        std::vector<int> separator;

        for (;;) {
            int cut_size = cutter.get_current_cut().size();
            int small_side_size = cutter.get_current_smaller_cut_side_size();

            if (cut_size > max_separator_size)
                break;

            

            if (balance_div * small_side_size > balance_num * (node_count - cut_size)) {

                double score = (double)cut_size / (double)small_side_size;
                if (score < best_score) {
                    separator = remove_nodes_from_separator_as_long_as_result_is_balanced(tail, head, expanded_graph::extract_original_separator(tail, head, cutter).sep);
                    score = (double)separator.size() / (double)small_side_size;
                    best_score = score;
                }

                double potential_best_next_score = (double)(cut_size + 1) / (double)(expanded_graph::expanded_node_count(node_count) / 2);
                if (potential_best_next_score >= best_score)
                    break;
            }

            if (!cutter.advance())
                break;
        }

        return separator;
    }